

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Pos af_cjk_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_UInt base_flags,
                 FT_UInt stem_flags)

{
  AF_StyleMetrics_conflict pAVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar4 = hints->other_flags;
  if ((uVar4 & 4) == 0) {
    return width;
  }
  pAVar1 = hints->metrics;
  lVar9 = (ulong)dim * 0x3838;
  uVar5 = -width;
  if (0 < width) {
    uVar5 = width;
  }
  if (dim == AF_DIMENSION_VERT) {
    uVar6 = uVar4 & 2;
  }
  else {
    uVar6 = uVar4 & 1;
  }
  if (uVar6 == 0) {
    if (*(int *)((long)pAVar1 + lVar9 + 0x60) != 0) {
      uVar3 = *(ulong *)((long)pAVar1 + lVar9 + 0x70);
      uVar7 = uVar5 - uVar3;
      uVar8 = -uVar7;
      if (0 < (long)uVar7) {
        uVar8 = uVar7;
      }
      if (uVar8 < 0x28) {
        uVar5 = 0x30;
        if (0x30 < (long)uVar3) {
          uVar5 = uVar3;
        }
        goto LAB_0017c8bc;
      }
    }
    uVar4 = (uint)uVar5;
    if (uVar5 < 0x36) {
      uVar5 = uVar5 + (0x36 - uVar4 >> 1);
    }
    else if (uVar5 < 0xc0) {
      uVar6 = uVar4 & 0x3f;
      if (9 < (ulong)uVar6) {
        if (uVar6 < 0x16) {
          uVar5 = (ulong)(uVar4 & 0xc0) | 10;
        }
        else if ((ulong)uVar6 - 0x2a < 0xc) {
          uVar5 = (ulong)(uVar4 & 0xc0) | 0x36;
        }
      }
    }
    goto LAB_0017c8bc;
  }
  lVar10 = 0x62;
  uVar3 = uVar5;
  for (lVar11 = 0; (ulong)*(uint *)((long)pAVar1 + lVar9 + 0x60) * 0x18 - lVar11 != 0;
      lVar11 = lVar11 + 0x18) {
    uVar8 = *(ulong *)((long)pAVar1 + lVar11 + lVar9 + 0x70);
    lVar12 = uVar5 - uVar8;
    lVar13 = -lVar12;
    if (0 < lVar12) {
      lVar13 = lVar12;
    }
    if (lVar13 < lVar10) {
      uVar3 = uVar8;
      lVar10 = lVar13;
    }
  }
  uVar8 = uVar3 + 0x20 & 0xffffffffffffffc0;
  bVar2 = (long)uVar5 < (long)(uVar8 | 0x30);
  if ((long)uVar5 < (long)uVar3) {
    bVar2 = (long)(uVar8 - 0x30) < (long)uVar5;
  }
  if (bVar2) {
    uVar5 = uVar3;
  }
  if (dim == AF_DIMENSION_VERT) {
    if ((long)uVar5 < 0x40) {
LAB_0017c88e:
      uVar5 = 0x40;
      goto LAB_0017c8bc;
    }
    uVar5 = uVar5 + 0x10;
  }
  else {
    if ((uVar4 & 8) == 0) {
      if ((long)uVar5 < 0x30) {
        uVar5 = (long)(uVar5 + 0x40) >> 1;
        goto LAB_0017c8bc;
      }
      if (uVar5 < 0x80) {
        uVar5 = (ulong)((int)uVar5 + 0x16U & 0xc0);
        goto LAB_0017c8bc;
      }
    }
    else if ((long)uVar5 < 0x40) goto LAB_0017c88e;
    uVar5 = uVar5 + 0x20;
  }
  uVar5 = uVar5 & 0x7fffffffffffffc0;
LAB_0017c8bc:
  uVar3 = -uVar5;
  if (-1 < width) {
    uVar3 = uVar5;
  }
  return uVar3;
}

Assistant:

static FT_Pos
  af_cjk_compute_stem_width( AF_GlyphHints  hints,
                             AF_Dimension   dim,
                             FT_Pos         width,
                             FT_UInt        base_flags,
                             FT_UInt        stem_flags )
  {
    AF_CJKMetrics  metrics  = (AF_CJKMetrics)hints->metrics;
    AF_CJKAxis     axis     = &metrics->axis[dim];
    FT_Pos         dist     = width;
    FT_Int         sign     = 0;
    FT_Bool        vertical = FT_BOOL( dim == AF_DIMENSION_VERT );

    FT_UNUSED( base_flags );
    FT_UNUSED( stem_flags );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      if ( axis->width_count > 0 )
      {
        if ( FT_ABS( dist - axis->widths[0].cur ) < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }
      }

      if ( dist < 54 )
        dist += ( 54 - dist ) / 2;
      else if ( dist < 3 * 64 )
      {
        FT_Pos  delta;


        delta  = dist & 63;
        dist  &= -64;

        if ( delta < 10 )
          dist += delta;
        else if ( delta < 22 )
          dist += 10;
        else if ( delta < 42 )
          dist += delta;
        else if ( delta < 54 )
          dist += 54;
        else
          dist += delta;
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      dist = af_cjk_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
            dist = ( dist + 22 ) & ~63;
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }